

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cam.c
# Opt level: O0

void glmc_persp_decomp_y(vec4 *proj,float *top,float *bottom)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *bottom_local;
  float *top_local;
  vec4 *proj_local;
  float m22;
  float m11;
  float m21;
  float nearZ;
  
  fVar1 = proj[2][1];
  fVar2 = proj[1][1];
  fVar3 = proj[3][2] / (proj[2][2] - 1.0);
  *bottom = (fVar3 * (fVar1 - 1.0)) / fVar2;
  *top = (fVar3 * (fVar1 + 1.0)) / fVar2;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_persp_decomp_y(mat4 proj,
                    float * __restrict top,
                    float * __restrict bottom) {
  glm_persp_decomp_y(proj, top, bottom);
}